

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O2

void __thiscall
QMenuPrivate::setCurrentAction
          (QMenuPrivate *this,QAction *action,int popup,SelectionReason reason,bool activateFirst)

{
  QPointer<QAction> *this_00;
  Data *pDVar1;
  long lVar2;
  QObject *pQVar3;
  QAction *this_01;
  bool bVar4;
  char cVar5;
  FocusPolicy FVar6;
  QMenu *pQVar7;
  QWidget *pQVar8;
  QWidget *pQVar9;
  FocusReason reason_00;
  QAction *pQVar10;
  QObject *pQVar11;
  long in_FS_OFFSET;
  QRect local_58;
  qsizetype local_48;
  QAction *action_local;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar9 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  this->field_0x421 = this->field_0x421 & 0xf7;
  action_local = action;
  bVar4 = considerAction(this,action);
  if (!bVar4) {
    action_local = (QAction *)0x0;
    action = (QAction *)0x0;
  }
  if (reason != SelectedFromKeyboard) {
    pDVar1 = (this->causedPopup).widget.wp.d;
    if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
      pQVar11 = (QObject *)0x0;
    }
    else {
      pQVar11 = (this->causedPopup).widget.wp.value;
    }
    pQVar7 = QtPrivate::qobject_cast_helper<QMenu*,QObject>(pQVar11);
    if (pQVar7 != (QMenu *)0x0) {
      this_00 = &(this->causedPopup).action;
      bVar4 = QPointer::operator_cast_to_bool((QPointer *)this_00);
      if (bVar4) {
        lVar2 = *(long *)&(pQVar7->super_QWidget).field_0x8;
        if ((*(long *)(lVar2 + 0x2e8) == 0) || (*(int *)(*(long *)(lVar2 + 0x2e8) + 4) == 0)) {
          pQVar8 = (QWidget *)0x0;
        }
        else {
          pQVar8 = *(QWidget **)(lVar2 + 0x2f0);
        }
        if ((pQVar8 == pQVar9) && ((this->field_0x420 & 0x40) != 0)) {
          bVar4 = ::operator!=((QAction **)(lVar2 + 0x288),this_00);
          if (bVar4) {
            pDVar1 = (this_00->wp).d;
            if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
              pQVar10 = (QAction *)0x0;
            }
            else {
              pQVar10 = (QAction *)(this->causedPopup).action.wp.value;
            }
            setCurrentAction(*(QMenuPrivate **)&(pQVar7->super_QWidget).field_0x8,pQVar10,0,reason,
                             false);
          }
        }
      }
    }
  }
  if (this->currentAction != (QAction *)0x0) {
    local_58 = actionRect(this,this->currentAction);
    QWidget::update(pQVar9,&local_58);
  }
  pDVar1 = (this->activeMenu).wp.d;
  if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
    pQVar11 = (QObject *)0x0;
  }
  else {
    pQVar11 = (this->activeMenu).wp.value;
  }
  pQVar10 = this->currentAction;
  this->currentAction = action;
  if (action == (QAction *)0x0) {
    if (pQVar10 != (QAction *)0x0) {
      pQVar3 = *(QObject **)(pQVar10 + 8);
      pQVar9 = topCausedWidget(this);
      local_58 = (QRect)ZEXT816(0);
      local_48 = 0;
      QActionPrivate::showStatusText(pQVar3,(QString *)pQVar9);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
    }
  }
  else {
    cVar5 = QAction::isSeparator();
    if (cVar5 == '\0') {
      activateAction(this,action,Hover,true);
      if ((popup != -1) && ((pQVar9->data->widget_attributes & 0x8000) != 0)) {
        popupAction(this,this->currentAction,popup,activateFirst);
      }
      local_58 = actionRect(this,action);
      QWidget::update(pQVar9,&local_58);
      if (reason == SelectedFromKeyboard) {
        pQVar8 = QHash<QAction_*,_QWidget_*>::value(&this->widgetItems,&action_local);
        if (pQVar8 == (QWidget *)0x0) {
          bVar4 = QWidget::hasFocus(pQVar9);
          if (!bVar4) {
            reason_00 = PopupFocusReason;
            goto LAB_00420492;
          }
        }
        else {
          FVar6 = QWidget::focusPolicy(pQVar8);
          if (FVar6 != NoFocus) {
            reason_00 = TabFocusReason;
            pQVar9 = pQVar8;
LAB_00420492:
            QWidget::setFocus(pQVar9,reason_00);
          }
        }
      }
    }
  }
  if ((pQVar11 != (QObject *)0x0) && (this_01 = this->currentAction, pQVar10 != this_01)) {
    if (popup == -1) {
      qFadeEffect((QWidget *)0x0,-1);
      qScrollEffect((QWidget *)0x0,8,-1);
      hideMenu(this,(QMenu *)pQVar11);
    }
    else {
      if (this_01 != (QAction *)0x0) {
        pQVar7 = QAction::menu<QMenu*>(this_01);
        if (pQVar7 != (QMenu *)0x0) goto LAB_004204f2;
      }
      QMenuSloppyState::startTimerIfNotRunning(&this->sloppyState);
    }
  }
LAB_004204f2:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMenuPrivate::setCurrentAction(QAction *action, int popup, SelectionReason reason, bool activateFirst)
{
    Q_Q(QMenu);
    tearoffHighlighted = 0;

    if (!considerAction(action))
        action = nullptr;

    // Reselect the currently active action in case mouse moved over other menu items when
    // moving from sub menu action to sub menu (QTBUG-20094).
    if (reason != SelectedFromKeyboard) {
        if (QMenu *menu = qobject_cast<QMenu*>(causedPopup.widget)) {
            if (causedPopup.action && menu->d_func()->activeMenu == q)
                // Reselect parent menu action only if mouse is over a menu and parent menu action is not already selected (QTBUG-47987)
                if (hasReceievedEnter && menu->d_func()->currentAction != causedPopup.action)
                    menu->d_func()->setCurrentAction(causedPopup.action, 0, reason, false);
        }
    }

    if (currentAction)
        q->update(actionRect(currentAction));

    QMenu *hideActiveMenu = activeMenu;
    QAction *previousAction = currentAction;

    currentAction = action;
    if (action) {
        if (!action->isSeparator()) {
            activateAction(action, QAction::Hover);
            if (popup != -1) {
                // if the menu is visible then activate the required action,
                // otherwise we just mark the action as currentAction
                // and activate it when the menu will be popuped.
                if (q->isVisible())
                    popupAction(currentAction, popup, activateFirst);
            }
            q->update(actionRect(action));

            if (reason == SelectedFromKeyboard) {
                QWidget *widget = widgetItems.value(action);
                if (widget) {
                    if (widget->focusPolicy() != Qt::NoFocus)
                        widget->setFocus(Qt::TabFocusReason);
                } else {
                    //when the action has no QWidget, the QMenu itself should
                    // get the focus
                    // Since the menu is a pop-up, it uses the popup reason.
                    if (!q->hasFocus()) {
                        q->setFocus(Qt::PopupFocusReason);
                    }
                }
            }
        }
#if QT_CONFIG(statustip)
    }  else if (previousAction) {
        previousAction->d_func()->showStatusText(topCausedWidget(), QString());
#endif
    }
    if (hideActiveMenu && previousAction != currentAction) {
        if (popup == -1) {
#if QT_CONFIG(effects)
            // kill any running effect
            qFadeEffect(nullptr);
            qScrollEffect(nullptr);
#endif
            hideMenu(hideActiveMenu);
        } else if (!currentAction || !currentAction->menu()) {
            sloppyState.startTimerIfNotRunning();
        }
    }
}